

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cc
# Opt level: O2

void __thiscall
hgdb::rtl::ExpressionPrinter::handle(ExpressionPrinter *this,ElementSelectExpression *sym)

{
  Expression *this_00;
  ConstantValue *constant;
  ostream *poVar1;
  NotSupportedException *this_01;
  optional<long> oVar2;
  allocator<char> local_39;
  string local_38;
  
  this_00 = sym->selector_;
  slang::ast::Expression::visit<hgdb::rtl::ExpressionPrinter&>(sym->value_,this);
  constant = this_00->constant;
  if (constant == (ConstantValue *)0x0) {
    std::operator<<((ostream *)&this->field_0x18,".");
    slang::ast::Expression::visit<hgdb::rtl::ExpressionPrinter&>(this_00,this);
    return;
  }
  oVar2 = get_constant_value(constant);
  if (((undefined1  [16])
       oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    poVar1 = std::operator<<((ostream *)&this->field_0x18,'[');
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,']');
    return;
  }
  this_01 = (NotSupportedException *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Only integer selection is supported",&local_39);
  NotSupportedException::NotSupportedException(this_01,&local_38,*this->loc_);
  __cxa_throw(this_01,&NotSupportedException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void handle(const slang::ast::ElementSelectExpression &sym) {
        auto const &value = sym.value();
        auto const &selector = sym.selector();

        value.visit(*this);

        // depends on whether the selector is a constant or not
        std::optional<uint64_t> select_value;
        if (selector.constant) {
            auto const &v = *selector.constant;
            select_value = get_constant_value(v);
            if (select_value) {
                ss_ << '[' << *select_value << ']';
            } else {
                throw NotSupportedException("Only integer selection is supported", loc_);
            }
        } else {
            ss_ << ".";
            selector.visit(*this);
        }
    }